

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

voffset_t flatbuffers::FieldIndexToOffset(voffset_t field_id)

{
  unsigned_short uVar1;
  ulong uVar2;
  size_t offset;
  voffset_t fixed_fields;
  voffset_t field_id_local;
  
  uVar2 = (ulong)field_id * 2 + 4;
  uVar1 = std::numeric_limits<unsigned_short>::max();
  if (uVar2 < uVar1) {
    return (voffset_t)uVar2;
  }
  __assert_fail("offset < std::numeric_limits<voffset_t>::max()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                ,0x31,"voffset_t flatbuffers::FieldIndexToOffset(voffset_t)");
}

Assistant:

inline voffset_t FieldIndexToOffset(voffset_t field_id) {
  // Should correspond to what EndTable() below builds up.
  const voffset_t fixed_fields =
      2 * sizeof(voffset_t);  // Vtable size and Object Size.
  size_t offset = fixed_fields + field_id * sizeof(voffset_t);
  FLATBUFFERS_ASSERT(offset < std::numeric_limits<voffset_t>::max());
  return static_cast<voffset_t>(offset);
}